

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O0

int FsStringToKeyCode(char *str)

{
  int iVar1;
  bool bVar2;
  int local_120;
  int local_11c;
  int i_1;
  int i;
  char upper [256];
  char *str_local;
  
  upper._248_8_ = str;
  if (str != (char *)0x0) {
    local_11c = 0;
    while( true ) {
      bVar2 = false;
      if (local_11c < 0xff) {
        bVar2 = *(char *)(upper._248_8_ + (long)local_11c) != '\0';
      }
      if (!bVar2) break;
      *(undefined1 *)((long)&i_1 + (long)local_11c) =
           *(undefined1 *)(upper._248_8_ + (long)local_11c);
      *(undefined1 *)((long)&i_1 + (long)(local_11c + 1)) = 0;
      if (('`' < *(char *)((long)&i_1 + (long)local_11c)) &&
         (*(char *)((long)&i_1 + (long)local_11c) < '{')) {
        *(char *)((long)&i_1 + (long)local_11c) = *(char *)((long)&i_1 + (long)local_11c) + -0x20;
      }
      local_11c = local_11c + 1;
    }
    for (local_120 = 0; local_120 < 0x65; local_120 = local_120 + 1) {
      iVar1 = strcmp((char *)&i_1,keyCodeToStr[local_120]);
      if (iVar1 == 0) {
        return local_120;
      }
    }
  }
  return 0;
}

Assistant:

int FsStringToKeyCode(const char str[])
{
	if(nullptr==str)
	{
		return FSKEY_NULL;
	}

	char upper[256];
	for(int i=0; i<255 && 0!=str[i]; ++i)
	{
		upper[i  ]=str[i];
		upper[i+1]=0;
		if('a'<=upper[i] && upper[i]<='z')
		{
			upper[i]=upper[i]+'A'-'a';
		}
	}
	for(int i=0; i<FSKEY_NUM_KEYCODE; ++i)
	{
		if(0==strcmp(upper,keyCodeToStr[i]))
		{
			return i;
		}
	}
	return FSKEY_NULL;
}